

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDisplayer.cpp
# Opt level: O0

void __thiscall
TextDisplayer::writeText(TextDisplayer *this,string *text,GLint pixelSize,bool rotateColours)

{
  bool bVar1;
  int iVar2;
  Colour *this_00;
  GLfloat *pGVar3;
  reference pcVar4;
  int iVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator it;
  int i;
  bool rotateColours_local;
  GLint pixelSize_local;
  string *text_local;
  TextDisplayer *this_local;
  
  it._M_current._4_4_ = 0;
  local_30._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_38._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    if (rotateColours) {
      this_00 = Palette::getColour(this->palette,it._M_current._4_4_);
      pGVar3 = Colour::getColour3fv(this_00);
      glColor3fv(pGVar3);
      iVar5 = it._M_current._4_4_ + 1;
      it._M_current._4_4_ = iVar5;
      iVar2 = Palette::getPrimaryColourCount(this->palette);
      if (iVar5 == iVar2) {
        it._M_current._4_4_ = 0;
      }
    }
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    drawCharacter(this,*pcVar4,pixelSize);
    glTranslatef((float)pixelSize,0);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void TextDisplayer::writeText(const string& text, GLint pixelSize, bool rotateColours) {
    int i = 0;
    for(auto it = text.begin(); it != text.end(); ++it) {
        if (rotateColours) {
            glColor3fv(palette->getColour(i)->getColour3fv());
            if (++i == palette->getPrimaryColourCount()) {
                i = 0;
            }
        }
        drawCharacter(*it, pixelSize);
        glTranslatef(pixelSize, 0.0f, 0.0f);
    }
}